

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O1

int x509_print_rsa_pss_params(BIO *bp,X509_ALGOR *sigalg,int indent,ASN1_PCTX *pctx)

{
  int iVar1;
  RSA_PSS_PARAMS *val;
  X509_ALGOR *a;
  char *buf;
  uint uVar2;
  
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  if (iVar1 != 0x390) {
    __assert_fail("OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0x117,
                  "int x509_print_rsa_pss_params(BIO *, const X509_ALGOR *, int, ASN1_PCTX *)");
  }
  val = rsa_pss_decode(sigalg);
  if (val == (RSA_PSS_PARAMS *)0x0) {
    iVar1 = BIO_puts((BIO *)bp," (INVALID PSS PARAMETERS)\n");
    uVar2 = (uint)(0 < iVar1);
    a = (X509_ALGOR *)0x0;
    goto LAB_0021ba43;
  }
  iVar1 = BIO_puts((BIO *)bp,"\n");
  if (iVar1 < 1) {
LAB_0021ba3d:
    a = (X509_ALGOR *)0x0;
  }
  else {
    iVar1 = BIO_indent((BIO *)bp,indent,0x80);
    if (iVar1 == 0) goto LAB_0021ba3d;
    iVar1 = BIO_puts((BIO *)bp,"Hash Algorithm: ");
    if (iVar1 < 1) goto LAB_0021ba3d;
    if (val->hashAlgorithm == (X509_ALGOR *)0x0) {
      iVar1 = BIO_puts((BIO *)bp,"sha1 (default)");
    }
    else {
      iVar1 = i2a_ASN1_OBJECT((BIO *)bp,(ASN1_OBJECT *)val->hashAlgorithm->algorithm);
    }
    if (iVar1 < 1) goto LAB_0021ba3d;
    iVar1 = BIO_puts((BIO *)bp,"\n");
    if (iVar1 < 1) goto LAB_0021ba3d;
    iVar1 = BIO_indent((BIO *)bp,indent,0x80);
    if (iVar1 == 0) goto LAB_0021ba3d;
    iVar1 = BIO_puts((BIO *)bp,"Mask Algorithm: ");
    if (iVar1 < 1) goto LAB_0021ba3d;
    if (val->maskGenAlgorithm == (X509_ALGOR *)0x0) {
      buf = "mgf1 with sha1 (default)";
LAB_0021ba76:
      iVar1 = BIO_puts((BIO *)bp,buf);
      a = (X509_ALGOR *)0x0;
LAB_0021ba87:
      uVar2 = 0;
      if (iVar1 < 1) goto LAB_0021ba43;
      BIO_puts((BIO *)bp,"\n");
      iVar1 = BIO_indent((BIO *)bp,indent,0x80);
      if (iVar1 != 0) {
        iVar1 = BIO_puts((BIO *)bp,"Salt Length: 0x");
        if (0 < iVar1) {
          if ((ASN1_INTEGER *)val->saltLength == (ASN1_INTEGER *)0x0) {
            iVar1 = BIO_puts((BIO *)bp,"14 (default)");
          }
          else {
            iVar1 = i2a_ASN1_INTEGER((BIO *)bp,(ASN1_INTEGER *)val->saltLength);
          }
          if (0 < iVar1) {
            BIO_puts((BIO *)bp,"\n");
            iVar1 = BIO_indent((BIO *)bp,indent,0x80);
            if (iVar1 != 0) {
              iVar1 = BIO_puts((BIO *)bp,"Trailer Field: 0x");
              if (0 < iVar1) {
                if ((ASN1_INTEGER *)val->trailerField == (ASN1_INTEGER *)0x0) {
                  iVar1 = BIO_puts((BIO *)bp,"BC (default)");
                }
                else {
                  iVar1 = i2a_ASN1_INTEGER((BIO *)bp,(ASN1_INTEGER *)val->trailerField);
                }
                if (0 < iVar1) {
                  BIO_puts((BIO *)bp,"\n");
                  uVar2 = 1;
                  goto LAB_0021ba43;
                }
              }
            }
          }
        }
      }
    }
    else {
      a = (X509_ALGOR *)rsa_mgf1_decode(val->maskGenAlgorithm);
      if (a == (X509_ALGOR *)0x0) {
        buf = "INVALID";
        goto LAB_0021ba76;
      }
      iVar1 = i2a_ASN1_OBJECT((BIO *)bp,(ASN1_OBJECT *)val->maskGenAlgorithm->algorithm);
      if (0 < iVar1) {
        iVar1 = BIO_puts((BIO *)bp," with ");
        if (iVar1 < 1) goto LAB_0021ba40;
        iVar1 = i2a_ASN1_OBJECT((BIO *)bp,a->algorithm);
        goto LAB_0021ba87;
      }
    }
  }
LAB_0021ba40:
  uVar2 = 0;
LAB_0021ba43:
  ASN1_item_free((ASN1_VALUE *)val,(ASN1_ITEM *)&RSA_PSS_PARAMS_it);
  X509_ALGOR_free(a);
  return uVar2;
}

Assistant:

int x509_print_rsa_pss_params(BIO *bp, const X509_ALGOR *sigalg, int indent,
                              ASN1_PCTX *pctx) {
  assert(OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss);

  int rv = 0;
  X509_ALGOR *maskHash = NULL;
  RSA_PSS_PARAMS *pss = rsa_pss_decode(sigalg);
  if (!pss) {
    if (BIO_puts(bp, " (INVALID PSS PARAMETERS)\n") <= 0) {
      goto err;
    }
    rv = 1;
    goto err;
  }

  if (BIO_puts(bp, "\n") <= 0 ||       //
      !BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Hash Algorithm: ") <= 0) {
    goto err;
  }

  if (pss->hashAlgorithm) {
    if (i2a_ASN1_OBJECT(bp, pss->hashAlgorithm->algorithm) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "sha1 (default)") <= 0) {
    goto err;
  }

  if (BIO_puts(bp, "\n") <= 0 ||       //
      !BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Mask Algorithm: ") <= 0) {
    goto err;
  }

  if (pss->maskGenAlgorithm) {
    maskHash = rsa_mgf1_decode(pss->maskGenAlgorithm);
    if (maskHash == NULL) {
      if (BIO_puts(bp, "INVALID") <= 0) {
        goto err;
      }
    } else {
      if (i2a_ASN1_OBJECT(bp, pss->maskGenAlgorithm->algorithm) <= 0 ||
          BIO_puts(bp, " with ") <= 0 ||
          i2a_ASN1_OBJECT(bp, maskHash->algorithm) <= 0) {
        goto err;
      }
    }
  } else if (BIO_puts(bp, "mgf1 with sha1 (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  if (!BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Salt Length: 0x") <= 0) {
    goto err;
  }

  if (pss->saltLength) {
    if (i2a_ASN1_INTEGER(bp, pss->saltLength) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "14 (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  if (!BIO_indent(bp, indent, 128) ||  //
      BIO_puts(bp, "Trailer Field: 0x") <= 0) {
    goto err;
  }

  if (pss->trailerField) {
    if (i2a_ASN1_INTEGER(bp, pss->trailerField) <= 0) {
      goto err;
    }
  } else if (BIO_puts(bp, "BC (default)") <= 0) {
    goto err;
  }
  BIO_puts(bp, "\n");

  rv = 1;

err:
  RSA_PSS_PARAMS_free(pss);
  X509_ALGOR_free(maskHash);
  return rv;
}